

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Int ft_var_get_item_delta
                 (TT_Face face,GX_ItemVarStore itemStore,FT_UInt outerIndex,FT_UInt innerIndex)

{
  FT_UInt FVar1;
  GX_ItemVarData pGVar2;
  FT_Short *pFVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  FT_Long FVar9;
  long b_;
  ulong uVar10;
  long a_;
  FT_Fixed *pFVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  FT_Int FVar16;
  
  pGVar2 = itemStore->varData;
  FVar1 = pGVar2[outerIndex].regionIdxCount;
  if (FVar1 == 0) {
    FVar16 = 0;
  }
  else {
    pFVar3 = pGVar2[outerIndex].deltaSet;
    uVar10 = 0;
    iVar15 = 0;
    do {
      if (itemStore->axisCount == 0) {
        lVar8 = 0x10000;
      }
      else {
        pFVar11 = &(itemStore->varRegionList[pGVar2[outerIndex].regionIndices[uVar10]].axisList)->
                   endCoord;
        uVar13 = 0x10000;
        uVar12 = 0;
        do {
          lVar8 = ((GX_AxisCoordsRec_ *)(pFVar11 + -2))->startCoord;
          lVar4 = pFVar11[-1];
          iVar7 = 0x10000;
          if (lVar8 <= lVar4) {
            lVar5 = *pFVar11;
            b_ = lVar5 - lVar4;
            if (lVar4 <= lVar5) {
              if ((lVar4 != 0) && (-1 < lVar8 || lVar5 < 1)) {
                lVar6 = face->blend->normalizedcoords[uVar12];
                if (lVar6 < lVar8) {
                  iVar7 = 0;
                }
                else {
                  iVar7 = 0;
                  a_ = lVar5 - lVar6;
                  if ((lVar6 <= lVar5) && (iVar7 = 0x10000, lVar6 != lVar4)) {
                    if (lVar6 < lVar4) {
                      b_ = lVar4 - lVar8;
                      a_ = lVar6 - lVar8;
                    }
                    FVar9 = FT_DivFix(a_,b_);
                    iVar7 = (int)FVar9;
                  }
                }
              }
            }
          }
          lVar8 = (long)iVar7 * (long)(int)uVar13;
          uVar14 = lVar8 + (lVar8 >> 0x3f) + 0x8000;
          uVar13 = uVar14 >> 0x10;
          uVar12 = uVar12 + 1;
          pFVar11 = pFVar11 + 3;
        } while (uVar12 < itemStore->axisCount);
        lVar8 = (long)(int)(uVar14 >> 0x10);
      }
      lVar8 = (int)((uint)(ushort)pFVar3[FVar1 * innerIndex + uVar10] << 0x10) * lVar8;
      iVar15 = iVar15 + (int)((ulong)((lVar8 >> 0x3f) + lVar8 + 0x8000) >> 0x10);
      uVar10 = uVar10 + 1;
    } while (uVar10 < pGVar2[outerIndex].regionIdxCount);
    FVar16 = iVar15 + 0x8000 >> 0x10;
  }
  return FVar16;
}

Assistant:

static FT_Int
  ft_var_get_item_delta( TT_Face          face,
                         GX_ItemVarStore  itemStore,
                         FT_UInt          outerIndex,
                         FT_UInt          innerIndex )
  {
    GX_ItemVarData  varData;
    FT_Short*       deltaSet;

    FT_UInt   master, j;
    FT_Fixed  netAdjustment = 0;     /* accumulated adjustment */
    FT_Fixed  scaledDelta;
    FT_Fixed  delta;


    /* See pseudo code from `Font Variations Overview' */
    /* in the OpenType specification.                  */

    varData  = &itemStore->varData[outerIndex];
    deltaSet = &varData->deltaSet[varData->regionIdxCount * innerIndex];

    /* outer loop steps through master designs to be blended */
    for ( master = 0; master < varData->regionIdxCount; master++ )
    {
      FT_Fixed  scalar      = FT_FIXED_ONE;
      FT_UInt   regionIndex = varData->regionIndices[master];

      GX_AxisCoords  axis = itemStore->varRegionList[regionIndex].axisList;


      /* inner loop steps through axes in this region */
      for ( j = 0; j < itemStore->axisCount; j++, axis++ )
      {
        FT_Fixed  axisScalar;


        /* compute the scalar contribution of this axis; */
        /* ignore invalid ranges                         */
        if ( axis->startCoord > axis->peakCoord ||
             axis->peakCoord > axis->endCoord   )
          axisScalar = FT_FIXED_ONE;

        else if ( axis->startCoord < 0 &&
                  axis->endCoord > 0   &&
                  axis->peakCoord != 0 )
          axisScalar = FT_FIXED_ONE;

        /* peak of 0 means ignore this axis */
        else if ( axis->peakCoord == 0 )
          axisScalar = FT_FIXED_ONE;

        /* ignore this region if coords are out of range */
        else if ( face->blend->normalizedcoords[j] < axis->startCoord ||
                  face->blend->normalizedcoords[j] > axis->endCoord   )
          axisScalar = 0;

        /* calculate a proportional factor */
        else
        {
          if ( face->blend->normalizedcoords[j] == axis->peakCoord )
            axisScalar = FT_FIXED_ONE;
          else if ( face->blend->normalizedcoords[j] < axis->peakCoord )
            axisScalar =
              FT_DivFix( face->blend->normalizedcoords[j] - axis->startCoord,
                         axis->peakCoord - axis->startCoord );
          else
            axisScalar =
              FT_DivFix( axis->endCoord - face->blend->normalizedcoords[j],
                         axis->endCoord - axis->peakCoord );
        }

        /* take product of all the axis scalars */
        scalar = FT_MulFix( scalar, axisScalar );

      } /* per-axis loop */

      /* get the scaled delta for this region */
      delta       = FT_intToFixed( deltaSet[master] );
      scaledDelta = FT_MulFix( scalar, delta );

      /* accumulate the adjustments from each region */
      netAdjustment = netAdjustment + scaledDelta;

    } /* per-region loop */

    return FT_fixedToInt( netAdjustment );
  }